

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovContext.cpp
# Opt level: O1

cl_context
cov::createContext(cl_context_properties *properties,cl_uint numDevices,cl_device_id *devices,
                  contextCallback pfnNotify,void *userData,cl_int *errcodeRet)

{
  ObjectMagic *pOVar1;
  int iVar2;
  Device *device;
  Context *this;
  cl_int cVar3;
  
  if (numDevices == 1) {
    device = (Device *)*devices;
    this = (Context *)operator_new(0x40,(nothrow_t *)&std::nothrow);
    if (this == (Context *)0x0) {
      this = (Context *)0x0;
    }
    else {
      Context::Context(this,device,pfnNotify,userData);
      *(undefined4 *)&this[1].super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>.m_icdTable = 1;
    }
    if (this == (Context *)0x0) {
      cVar3 = -6;
    }
    else {
      if ((this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess != false) {
        cVar3 = 0;
        goto LAB_00102634;
      }
      LOCK();
      pOVar1 = &(this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_magic;
      *(int *)pOVar1 = *(int *)pOVar1 + -1;
      UNLOCK();
      iVar2._0_1_ = (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_magic;
      iVar2._1_1_ = (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess;
      iVar2._2_2_ = *(undefined2 *)
                     &(this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).field_0xa;
      cVar3 = -5;
      if (iVar2 == 0) {
        operator_delete(this,0x10);
      }
    }
  }
  else {
    cVar3 = -2;
  }
  this = (Context *)0x0;
LAB_00102634:
  *errcodeRet = cVar3;
  return (cl_context)this;
}

Assistant:

cl_context createContext(const cl_context_properties* properties,
                         cl_uint numDevices,
                         const cl_device_id* devices,
                         contextCallback pfnNotify,
                         void* userData,
                         cl_int* errcodeRet)
{
    (void)properties; // current not used

    if (numDevices != 1) {
        // only support one device
        *errcodeRet = CL_DEVICE_NOT_AVAILABLE;
        return nullptr;
    }

    auto d = reinterpret_cast<const Device*>(devices[0]);
    auto context = new(std::nothrow) Countable<Context>(*d, pfnNotify, userData);
    if (!context) {
        *errcodeRet = CL_OUT_OF_HOST_MEMORY;
        return nullptr;
    }

    auto c = reinterpret_cast<Context*>(context);
    if (!c->initSuccess()) {
        c->release();
        *errcodeRet = CL_OUT_OF_RESOURCES;
        return nullptr;
    }

    *errcodeRet = CL_SUCCESS;
    return reinterpret_cast<_cl_context*>(c);
}